

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getinfo.c
# Opt level: O0

CURLcode getinfo_long(Curl_easy *data,CURLINFO info,long *param_longp)

{
  curl_socket_t cVar1;
  anon_union_8_2_2492ae6c lptr;
  curl_socket_t sockfd;
  long *param_longp_local;
  CURLINFO info_local;
  Curl_easy *data_local;
  
  switch(info) {
  case CURLINFO_RESPONSE_CODE:
    *param_longp = (long)(data->info).httpcode;
    break;
  default:
    return CURLE_UNKNOWN_OPTION;
  case CURLINFO_HEADER_SIZE:
    *param_longp = (data->info).header_size;
    break;
  case CURLINFO_REQUEST_SIZE:
    *param_longp = (data->info).request_size;
    break;
  case CURLINFO_SSL_VERIFYRESULT:
    *param_longp = (data->set).ssl.certverifyresult;
    break;
  case CURLINFO_FILETIME:
    if ((data->info).filetime <= 0x7fffffffffffffff) {
      if ((data->info).filetime < -0x8000000000000000) {
        *param_longp = -0x8000000000000000;
      }
      else {
        *param_longp = (data->info).filetime;
      }
    }
    else {
      *param_longp = 0x7fffffffffffffff;
    }
    break;
  case CURLINFO_REDIRECT_COUNT:
    *param_longp = (data->state).followlocation;
    break;
  case CURLINFO_HTTP_CONNECTCODE:
    *param_longp = (long)(data->info).httpproxycode;
    break;
  case CURLINFO_HTTPAUTH_AVAIL:
    *param_longp = (data->info).httpauthavail;
    break;
  case CURLINFO_PROXYAUTH_AVAIL:
    *param_longp = (data->info).proxyauthavail;
    break;
  case CURLINFO_OS_ERRNO:
    *param_longp = (long)(data->state).os_errno;
    break;
  case CURLINFO_NUM_CONNECTS:
    *param_longp = (data->info).numconnects;
    break;
  case CURLINFO_LASTSOCKET:
    cVar1 = Curl_getconnectinfo(data,(connectdata **)0x0);
    if (cVar1 == -1) {
      *param_longp = -1;
    }
    else {
      *param_longp = (long)cVar1;
    }
    break;
  case CURLINFO_CONDITION_UNMET:
    if ((data->info).httpcode == 0x130) {
      *param_longp = 1;
    }
    else {
      *param_longp = (ulong)(((data->info).field_0xe4 & 1) != 0);
    }
    break;
  case CURLINFO_RTSP_CLIENT_CSEQ:
    *param_longp = (data->state).rtsp_next_client_CSeq;
    break;
  case CURLINFO_RTSP_SERVER_CSEQ:
    *param_longp = (data->state).rtsp_next_server_CSeq;
    break;
  case CURLINFO_RTSP_CSEQ_RECV:
    *param_longp = (data->state).rtsp_CSeq_recv;
    break;
  case CURLINFO_PRIMARY_PORT:
    *param_longp = (long)(data->info).conn_primary_port;
    break;
  case CURLINFO_LOCAL_PORT:
    *param_longp = (long)(data->info).conn_local_port;
    break;
  case CURLINFO_HTTP_VERSION:
    switch((data->info).httpversion) {
    case 10:
      *param_longp = 1;
      break;
    case 0xb:
      *param_longp = 2;
      break;
    default:
      *param_longp = 0;
      break;
    case 0x14:
      *param_longp = 3;
      break;
    case 0x1e:
      *param_longp = 0x1e;
    }
    break;
  case CURLINFO_PROXY_SSL_VERIFYRESULT:
    *param_longp = (data->set).proxy_ssl.certverifyresult;
    break;
  case CURLINFO_PROTOCOL:
    *param_longp = (ulong)(data->info).conn_protocol;
    break;
  case CURLINFO_PROXY_ERROR:
    *param_longp = (ulong)(data->info).pxcode;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode getinfo_long(struct Curl_easy *data, CURLINFO info,
                             long *param_longp)
{
  curl_socket_t sockfd;

  union {
    unsigned long *to_ulong;
    long          *to_long;
  } lptr;

#ifdef DEBUGBUILD
  char *timestr = getenv("CURL_TIME");
  if(timestr) {
    unsigned long val = strtol(timestr, NULL, 10);
    switch(info) {
    case CURLINFO_LOCAL_PORT:
      *param_longp = (long)val;
      return CURLE_OK;
    default:
      break;
    }
  }
  /* use another variable for this to allow different values */
  timestr = getenv("CURL_DEBUG_SIZE");
  if(timestr) {
    unsigned long val = strtol(timestr, NULL, 10);
    switch(info) {
    case CURLINFO_HEADER_SIZE:
    case CURLINFO_REQUEST_SIZE:
      *param_longp = (long)val;
      return CURLE_OK;
    default:
      break;
    }
  }
#endif

  switch(info) {
  case CURLINFO_RESPONSE_CODE:
    *param_longp = data->info.httpcode;
    break;
  case CURLINFO_HTTP_CONNECTCODE:
    *param_longp = data->info.httpproxycode;
    break;
  case CURLINFO_FILETIME:
    if(data->info.filetime > LONG_MAX)
      *param_longp = LONG_MAX;
    else if(data->info.filetime < LONG_MIN)
      *param_longp = LONG_MIN;
    else
      *param_longp = (long)data->info.filetime;
    break;
  case CURLINFO_HEADER_SIZE:
    *param_longp = (long)data->info.header_size;
    break;
  case CURLINFO_REQUEST_SIZE:
    *param_longp = (long)data->info.request_size;
    break;
  case CURLINFO_SSL_VERIFYRESULT:
    *param_longp = data->set.ssl.certverifyresult;
    break;
#ifndef CURL_DISABLE_PROXY
  case CURLINFO_PROXY_SSL_VERIFYRESULT:
    *param_longp = data->set.proxy_ssl.certverifyresult;
    break;
#endif
  case CURLINFO_REDIRECT_COUNT:
    *param_longp = data->state.followlocation;
    break;
  case CURLINFO_HTTPAUTH_AVAIL:
    lptr.to_long = param_longp;
    *lptr.to_ulong = data->info.httpauthavail;
    break;
  case CURLINFO_PROXYAUTH_AVAIL:
    lptr.to_long = param_longp;
    *lptr.to_ulong = data->info.proxyauthavail;
    break;
  case CURLINFO_OS_ERRNO:
    *param_longp = data->state.os_errno;
    break;
  case CURLINFO_NUM_CONNECTS:
    *param_longp = data->info.numconnects;
    break;
  case CURLINFO_LASTSOCKET:
    sockfd = Curl_getconnectinfo(data, NULL);

    /* note: this is not a good conversion for systems with 64 bit sockets and
       32 bit longs */
    if(sockfd != CURL_SOCKET_BAD)
      *param_longp = (long)sockfd;
    else
      /* this interface is documented to return -1 in case of badness, which
         may not be the same as the CURL_SOCKET_BAD value */
      *param_longp = -1;
    break;
  case CURLINFO_PRIMARY_PORT:
    /* Return the (remote) port of the most recent (primary) connection */
    *param_longp = data->info.conn_primary_port;
    break;
  case CURLINFO_LOCAL_PORT:
    /* Return the local port of the most recent (primary) connection */
    *param_longp = data->info.conn_local_port;
    break;
  case CURLINFO_PROXY_ERROR:
    *param_longp = (long)data->info.pxcode;
    break;
  case CURLINFO_CONDITION_UNMET:
    if(data->info.httpcode == 304)
      *param_longp = 1L;
    else
      /* return if the condition prevented the document to get transferred */
      *param_longp = data->info.timecond ? 1L : 0L;
    break;
  case CURLINFO_RTSP_CLIENT_CSEQ:
    *param_longp = data->state.rtsp_next_client_CSeq;
    break;
  case CURLINFO_RTSP_SERVER_CSEQ:
    *param_longp = data->state.rtsp_next_server_CSeq;
    break;
  case CURLINFO_RTSP_CSEQ_RECV:
    *param_longp = data->state.rtsp_CSeq_recv;
    break;
  case CURLINFO_HTTP_VERSION:
    switch(data->info.httpversion) {
    case 10:
      *param_longp = CURL_HTTP_VERSION_1_0;
      break;
    case 11:
      *param_longp = CURL_HTTP_VERSION_1_1;
      break;
    case 20:
      *param_longp = CURL_HTTP_VERSION_2_0;
      break;
    case 30:
      *param_longp = CURL_HTTP_VERSION_3;
      break;
    default:
      *param_longp = CURL_HTTP_VERSION_NONE;
      break;
    }
    break;
  case CURLINFO_PROTOCOL:
    *param_longp = data->info.conn_protocol;
    break;
  default:
    return CURLE_UNKNOWN_OPTION;
  }

  return CURLE_OK;
}